

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

FTextureID __thiscall
DBaseDecal::StickToWall(DBaseDecal *this,side_t *wall,double x,double y,F3DFloor *ffloor)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  FNullTextureID local_90;
  int local_8c;
  FTexture *local_88;
  FTexture *texture;
  int local_78;
  int local_74;
  int local_70;
  TFlags local_6c [4];
  int local_68;
  TFlags local_64 [4];
  int local_60;
  TFlags local_5c [4];
  int local_58;
  FTextureID local_54;
  line_t_conflict *plStack_50;
  FTextureID tex;
  line_t_conflict *line;
  sector_t_conflict *back;
  sector_t_conflict *front;
  F3DFloor *ffloor_local;
  double y_local;
  double x_local;
  side_t *wall_local;
  DBaseDecal *this_local;
  
  this->Side = wall;
  this->WallPrev = wall->AttachedDecals;
  while( true ) {
    bVar2 = false;
    if (this->WallPrev != (DBaseDecal *)0x0) {
      bVar2 = this->WallPrev->WallNext != (DBaseDecal *)0x0;
    }
    if (!bVar2) break;
    this->WallPrev = this->WallPrev->WallNext;
  }
  if (this->WallPrev == (DBaseDecal *)0x0) {
    wall->AttachedDecals = this;
  }
  else {
    this->WallPrev->WallNext = this;
  }
  this->WallNext = (DBaseDecal *)0x0;
  FTextureID::FTextureID(&local_54);
  plStack_50 = wall->linedef;
  if (plStack_50->sidedef[0] == wall) {
    back = plStack_50->frontsector;
    line = (line_t_conflict *)plStack_50->backsector;
  }
  else {
    back = plStack_50->backsector;
    line = (line_t_conflict *)plStack_50->frontsector;
  }
  if (line == (line_t_conflict *)0x0) {
    this->RenderFlags = this->RenderFlags | 0x300;
    if ((plStack_50->flags & 0x10) == 0) {
      dVar3 = sector_t::GetPlaneTexZ((sector_t *)back,1);
      this->Z = this->Z - dVar3;
    }
    else {
      dVar3 = sector_t::GetPlaneTexZ((sector_t *)back,0);
      this->Z = this->Z - dVar3;
    }
    local_58 = (int)side_t::GetTexture(wall,1);
    local_54 = (FTextureID)local_58;
  }
  else {
    dVar3 = secplane_t::ZatPoint((secplane_t *)&line[1].delta.Y,x,y);
    if (dVar3 < this->Z) {
      dVar3 = secplane_t::ZatPoint((secplane_t *)&line[1].alpha,x,y);
      if (this->Z < dVar3) {
        if (ffloor == (F3DFloor *)0x0) {
          FNullTextureID::FNullTextureID((FNullTextureID *)((long)&texture + 4));
          return (FTextureID)texture._4_4_;
        }
        this->Sector = (sector_t_conflict *)ffloor->model;
        ::operator|((EnumType)local_6c,RF_RELMASK);
        uVar1 = ::TFlags::operator_cast_to_unsigned_int(local_6c);
        this->RenderFlags = uVar1 | this->RenderFlags;
        if ((plStack_50->flags & 0x10) == 0) {
          dVar3 = sector_t::GetPlaneTexZ((sector_t *)this->Sector,1);
          this->Z = this->Z - dVar3;
        }
        else {
          dVar3 = sector_t::GetPlaneTexZ((sector_t *)this->Sector,0);
          this->Z = this->Z - dVar3;
        }
        if ((ffloor->flags & 0x20000) == 0) {
          if ((ffloor->flags & 0x40000) == 0) {
            local_78 = (int)side_t::GetTexture(ffloor->master->sidedef[0],1);
            local_54 = (FTextureID)local_78;
          }
          else {
            local_74 = (int)side_t::GetTexture(wall,2);
            local_54 = (FTextureID)local_74;
          }
        }
        else {
          local_70 = (int)side_t::GetTexture(wall,0);
          local_54 = (FTextureID)local_70;
        }
      }
      else {
        ::operator|((EnumType)local_64,RF_RELUPPER);
        uVar1 = ::TFlags::operator_cast_to_unsigned_int(local_64);
        this->RenderFlags = uVar1 | this->RenderFlags;
        if ((plStack_50->flags & 8) == 0) {
          dVar3 = sector_t::GetPlaneTexZ((sector_t *)line,1);
          this->Z = this->Z - dVar3;
        }
        else {
          dVar3 = sector_t::GetPlaneTexZ((sector_t *)back,1);
          this->Z = this->Z - dVar3;
        }
        local_68 = (int)side_t::GetTexture(wall,0);
        local_54 = (FTextureID)local_68;
      }
    }
    else {
      ::operator|((EnumType)local_5c,RF_RELLOWER);
      uVar1 = ::TFlags::operator_cast_to_unsigned_int(local_5c);
      this->RenderFlags = uVar1 | this->RenderFlags;
      if ((plStack_50->flags & 0x10) == 0) {
        dVar3 = sector_t::GetPlaneTexZ((sector_t *)line,0);
        this->Z = this->Z - dVar3;
      }
      else {
        dVar3 = sector_t::GetPlaneTexZ((sector_t *)back,1);
        this->Z = this->Z - dVar3;
      }
      local_60 = (int)side_t::GetTexture(wall,2);
      local_54 = (FTextureID)local_60;
    }
  }
  CalcFracPos(this,wall,x,y);
  local_8c = local_54.texnum;
  local_88 = FTextureManager::operator[](&TexMan,local_54);
  if ((local_88 == (FTexture *)0x0) || ((*(ushort *)&local_88->field_0x31 & 1) != 0)) {
    FNullTextureID::FNullTextureID(&local_90);
    this_local._4_4_ = local_90.super_FTextureID.texnum;
  }
  else {
    this_local._4_4_ = local_54.texnum;
  }
  return (FTextureID)this_local._4_4_;
}

Assistant:

FTextureID DBaseDecal::StickToWall (side_t *wall, double x, double y, F3DFloor *ffloor)
{
	Side = wall;
	WallPrev = wall->AttachedDecals;

	while (WallPrev != nullptr && WallPrev->WallNext != nullptr)
	{
		WallPrev = WallPrev->WallNext;
	}
	if (WallPrev != nullptr) WallPrev->WallNext = this;
	else wall->AttachedDecals = this;
	WallNext = nullptr;


	sector_t *front, *back;
	line_t *line;
	FTextureID tex;

	line = wall->linedef;
	if (line->sidedef[0] == wall)
	{
		front = line->frontsector;
		back = line->backsector;
	}
	else
	{
		front = line->backsector;
		back = line->frontsector;
	}
	if (back == NULL)
	{
		RenderFlags |= RF_RELMID;
		if (line->flags & ML_DONTPEGBOTTOM)
			Z -= front->GetPlaneTexZ(sector_t::floor);
		else
			Z -= front->GetPlaneTexZ(sector_t::ceiling);
		tex = wall->GetTexture(side_t::mid);
	}
	else if (back->floorplane.ZatPoint (x, y) >= Z)
	{
		RenderFlags |= RF_RELLOWER|RF_CLIPLOWER;
		if (line->flags & ML_DONTPEGBOTTOM)
			Z -= front->GetPlaneTexZ(sector_t::ceiling);
		else
			Z -= back->GetPlaneTexZ(sector_t::floor);
		tex = wall->GetTexture(side_t::bottom);
	}
	else if (back->ceilingplane.ZatPoint (x, y) <= Z)
	{
		RenderFlags |= RF_RELUPPER|RF_CLIPUPPER;
		if (line->flags & ML_DONTPEGTOP)
			Z -= front->GetPlaneTexZ(sector_t::ceiling);
		else
			Z -= back->GetPlaneTexZ(sector_t::ceiling);
		tex = wall->GetTexture(side_t::top);
	}
	else if (ffloor) // this is a 3d-floor segment - do this only if we know which one!
	{
		Sector=ffloor->model;
		RenderFlags |= RF_RELMID|RF_CLIPMID;
		if (line->flags & ML_DONTPEGBOTTOM)
			Z -= Sector->GetPlaneTexZ(sector_t::floor);
		else
			Z -= Sector->GetPlaneTexZ(sector_t::ceiling);

		if (ffloor->flags & FF_UPPERTEXTURE)
		{
			tex = wall->GetTexture(side_t::top);
		}
		else if (ffloor->flags & FF_LOWERTEXTURE)
		{
			tex = wall->GetTexture(side_t::bottom);
		}
		else
		{
			tex = ffloor->master->sidedef[0]->GetTexture(side_t::mid);
		}
	}
	else return FNullTextureID();
	CalcFracPos (wall, x, y);

	FTexture *texture = TexMan[tex];

	if (texture == NULL || texture->bNoDecals)
	{
		return FNullTextureID();
	}

	return tex;
}